

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execShiftIm<(moira::Instr)14,(moira::Mode)11,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint cnt;
  
  cnt = 8;
  if ((opcode & 0xe00) != 0) {
    cnt = opcode >> 9 & 7;
  }
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,(ulong)(cnt * 2 + 4));
  uVar1 = shift<(moira::Instr)14,(moira::Size)4>
                    (this,cnt,(ulong)*(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58));
  *(u32 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar1;
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;

    prefetch<POLLIPL>();
    sync((S == Long ? 4 : 2) + 2 * cnt);

    writeD<S>(dst, shift<I,S>(cnt, readD<S>(dst)));
}